

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O2

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>::
ContIntToDescriptor(ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>
                    *this,uint off_L,ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  CoeffReturnType pdVar1;
  
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L);
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.l_i = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                      (ulong)(off_L + 1));
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.l_i = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                      (ulong)(off_L + 2));
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.l_i = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,(ulong)off_L)
  ;
  (this->Nx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.b_i = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                      (ulong)(off_L + 1));
  (this->Tu).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.b_i = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Qc,
                      (ulong)(off_L + 2));
  (this->Tv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.b_i = *pdVar1;
  return;
}

Assistant:

virtual void ContIntToDescriptor(const unsigned int off_L,
                                     const ChVectorDynamic<>& L,
                                     const ChVectorDynamic<>& Qc
                                     ) override {
        // only for solver warm start
        Nx.Set_l_i(L(off_L));
        Tu.Set_l_i(L(off_L + 1));
        Tv.Set_l_i(L(off_L + 2));

        // solver known terms
        Nx.Set_b_i(Qc(off_L));
        Tu.Set_b_i(Qc(off_L + 1));
        Tv.Set_b_i(Qc(off_L + 2));
    }